

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O0

void ASDCP::Rat_to_extended(Rational rate,byte_t *buf)

{
  ui32_t i_00;
  double dVar1;
  byte local_21;
  uint local_20;
  uint uStack_1c;
  ui8_t i;
  ui32_t exp;
  ui32_t value;
  byte_t *buf_local;
  Rational rate_local;
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf_local = (byte_t *)rate;
  dVar1 = Rational::Quotient((Rational *)&buf_local);
  dVar1 = ceil(dVar1);
  uStack_1c = (uint)(long)dVar1;
  local_20 = uStack_1c >> 1;
  local_21 = 0;
  while ((local_21 < 0x20 && (local_20 = local_20 >> 1, local_20 != 0))) {
    local_21 = local_21 + 1;
  }
  buf[1] = local_21;
  local_21 = ' ';
  for (; (local_21 != '\0' && ((uStack_1c & 0x80000000) == 0)); uStack_1c = uStack_1c << 1) {
    local_21 = local_21 + -1;
  }
  i_00 = Kumu::Swap4(uStack_1c);
  Kumu::i2p<unsigned_int>(i_00,buf + 2);
  return;
}

Assistant:

void
Rat_to_extended(ASDCP::Rational rate, byte_t* buf)
{
  memset(buf, 0, 10);
  ui32_t value = (ui32_t)ceil(rate.Quotient()); 
  ui32_t exp = value;
  exp >>= 1;
  ui8_t i = 0;

  for ( ; i < 32; i++ )
    {
      exp >>= 1;
      if ( ! exp )
	break;
    }

  *(buf+1) = i;

   for ( i = 32; i != 0 ; i-- )
     {
       if ( value & 0x80000000 )
	 break;
       value <<= 1;
     }

   Kumu::i2p<ui32_t>(KM_i32_BE(value), buf+2);
}